

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

void Gia_ManCountTents_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vRoots)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar3 = Gia_ManObj(p,iObj);
    uVar2 = (uint)*(undefined8 *)pGVar3;
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) break;
    Gia_ManCountTents_rec(p,iObj - (uVar2 & 0x1fffffff),vRoots);
    iObj = iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
  }
  iVar1 = Gia_ObjIsRo(p,pGVar3);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsPi(p,pGVar3);
    if (iVar1 != 0) {
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                  ,0x10c,"void Gia_ManCountTents_rec(Gia_Man_t *, int, Vec_Int_t *)");
  }
  pGVar3 = Gia_ObjRoToRi(p,pGVar3);
  iVar1 = Gia_ObjFaninId0p(p,pGVar3);
  Vec_IntPush(vRoots,iVar1);
  return;
}

Assistant:

void Gia_ManCountTents_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCountTents_rec( p, Gia_ObjFaninId0(pObj, iObj), vRoots );
        Gia_ManCountTents_rec( p, Gia_ObjFaninId1(pObj, iObj), vRoots );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( !Gia_ObjIsPi(p, pObj) )
        assert( 0 );
}